

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int set_str_d_characters_bp(archive_write *a,uchar *bp,int from,int to,char *s,vdc vdc)

{
  undefined4 in_ECX;
  undefined4 in_EDX;
  uchar *in_RSI;
  undefined8 in_RDI;
  size_t in_R8;
  int in_R9D;
  size_t unaff_retaddr;
  char *in_stack_00000008;
  int r;
  uint in_stack_ffffffffffffffd0;
  undefined4 local_28;
  char f;
  
  f = (char)((uint)in_R9D >> 0x18);
  if (in_R9D == 0) {
    set_str(in_RSI,(char *)CONCAT44(in_EDX,in_ECX),in_R8,f,(char *)(ulong)in_stack_ffffffffffffffd0)
    ;
    local_28 = 0;
  }
  else if (in_R9D == 1) {
    set_str(in_RSI,(char *)CONCAT44(in_EDX,in_ECX),in_R8,f,
            (char *)CONCAT44(1,in_stack_ffffffffffffffd0));
    local_28 = 0;
  }
  else if (in_R9D - 2U < 2) {
    local_28 = set_str_utf16be((archive_write *)s,(uchar *)CONCAT44(vdc,r),in_stack_00000008,
                               unaff_retaddr,(uint16_t)((ulong)in_RDI >> 0x30),(vdc)in_RDI);
  }
  else {
    local_28 = -0x1e;
  }
  return local_28;
}

Assistant:

static int
set_str_d_characters_bp(struct archive_write *a, unsigned char *bp,
    int from, int to, const char *s, enum  vdc vdc)
{
	int r;

	switch (vdc) {
	case VDC_STD:
		set_str(bp+from, s, to - from + 1, 0x20,
		    d_characters_map);
		r = ARCHIVE_OK;
		break;
	case VDC_LOWERCASE:
		set_str(bp+from, s, to - from + 1, 0x20,
		    d1_characters_map);
		r = ARCHIVE_OK;
		break;
	case VDC_UCS2:
	case VDC_UCS2_DIRECT:
		r = set_str_utf16be(a, bp+from, s, to - from + 1,
		    0x0020, vdc);
		break;
	default:
		r = ARCHIVE_FATAL;
	}
	return (r);
}